

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afglobal.c
# Opt level: O0

FT_Error af_face_globals_compute_style_coverage(AF_FaceGlobals globals)

{
  FT_Error FVar1;
  FT_UInt FVar2;
  uint local_80;
  FT_UInt nn;
  FT_UInt gindex_2;
  AF_StyleClass style_class_1;
  ulong uStack_68;
  FT_UInt gindex_1;
  FT_ULong charcode_1;
  ulong uStack_58;
  FT_UInt gindex;
  FT_ULong charcode;
  AF_Script_UniRange range;
  AF_ScriptClass script_class;
  AF_StyleClass style_class;
  FT_UInt i;
  FT_UShort dflt;
  FT_UShort ss;
  FT_UShort *gstyles;
  FT_CharMap old_charmap;
  FT_Face face;
  AF_FaceGlobals pAStack_10;
  FT_Error error;
  AF_FaceGlobals globals_local;
  
  old_charmap = (FT_CharMap)globals->face;
  gstyles = (FT_UShort *)((FT_Face)old_charmap)->charmap;
  _i = globals->glyph_styles;
  style_class._4_2_ = 0xffff;
  for (style_class._0_4_ = 0; (uint)style_class < globals->glyph_count;
      style_class._0_4_ = (uint)style_class + 1) {
    _i[(uint)style_class] = 0x3fff;
  }
  pAStack_10 = globals;
  FVar1 = FT_Select_Charmap((FT_Face)old_charmap,FT_ENCODING_UNICODE);
  if (FVar1 == 0) {
    face._4_4_ = 0;
    for (style_class._6_2_ = 0; af_style_classes[style_class._6_2_] != (AF_StyleClass)0x0;
        style_class._6_2_ = style_class._6_2_ + 1) {
      script_class = (AF_ScriptClass)af_style_classes[style_class._6_2_];
      range = (AF_Script_UniRange)af_script_classes[*(AF_Script *)&script_class->script_uni_ranges];
      if (((AF_ScriptClass)range)->script_uni_ranges != (AF_Script_UniRange)0x0) {
        if (*(AF_Coverage *)&script_class->script_uni_nonbase_ranges == AF_COVERAGE_DEFAULT) {
          if (*(AF_Script *)&script_class->script_uni_ranges == pAStack_10->module->default_script)
          {
            style_class._4_2_ = style_class._6_2_;
          }
          for (charcode = (FT_ULong)((AF_ScriptClass)range)->script_uni_ranges;
              *(int *)charcode != 0; charcode = charcode + 8) {
            uStack_58 = (ulong)*(uint *)charcode;
            charcode_1._4_4_ = FT_Get_Char_Index((FT_Face)old_charmap,uStack_58);
            if (((charcode_1._4_4_ != 0) && (charcode_1._4_4_ < pAStack_10->glyph_count)) &&
               ((_i[charcode_1._4_4_] & 0x3fff) == 0x3fff)) {
              _i[charcode_1._4_4_] = style_class._6_2_;
            }
            while ((uStack_58 = FT_Get_Next_Char((FT_Face)old_charmap,uStack_58,
                                                 (FT_UInt *)((long)&charcode_1 + 4)),
                   charcode_1._4_4_ != 0 && (uStack_58 <= *(uint *)(charcode + 4)))) {
              if ((charcode_1._4_4_ < pAStack_10->glyph_count) &&
                 ((_i[charcode_1._4_4_] & 0x3fff) == 0x3fff)) {
                _i[charcode_1._4_4_] = style_class._6_2_;
              }
            }
          }
          for (charcode = *(FT_ULong *)(range + 2); *(int *)charcode != 0; charcode = charcode + 8)
          {
            uStack_68 = (ulong)*(uint *)charcode;
            style_class_1._4_4_ = FT_Get_Char_Index((FT_Face)old_charmap,uStack_68);
            if (((style_class_1._4_4_ != 0) && (style_class_1._4_4_ < pAStack_10->glyph_count)) &&
               ((_i[style_class_1._4_4_] & 0x3fff) == style_class._6_2_)) {
              _i[style_class_1._4_4_] = _i[style_class_1._4_4_] | 0x4000;
            }
            while ((uStack_68 = FT_Get_Next_Char((FT_Face)old_charmap,uStack_68,
                                                 (FT_UInt *)((long)&style_class_1 + 4)),
                   style_class_1._4_4_ != 0 && (uStack_68 <= *(uint *)(charcode + 4)))) {
              if ((style_class_1._4_4_ < pAStack_10->glyph_count) &&
                 ((_i[style_class_1._4_4_] & 0x3fff) == style_class._6_2_)) {
                _i[style_class_1._4_4_] = _i[style_class_1._4_4_] | 0x4000;
              }
            }
          }
        }
        else {
          af_shaper_get_coverage(pAStack_10,(AF_StyleClass)script_class,_i,'\0');
        }
      }
    }
    for (style_class._6_2_ = 0; af_style_classes[style_class._6_2_] != (AF_StyleClass)0x0;
        style_class._6_2_ = style_class._6_2_ + 1) {
      if (af_style_classes[style_class._6_2_]->coverage == AF_COVERAGE_DEFAULT) {
        af_shaper_get_coverage(pAStack_10,af_style_classes[style_class._6_2_],_i,'\0');
      }
    }
    af_shaper_get_coverage(pAStack_10,af_style_classes[style_class._4_2_],_i,'\x01');
    for (style_class._0_4_ = 0x30; (uint)style_class < 0x3a;
        style_class._0_4_ = (uint)style_class + 1) {
      FVar2 = FT_Get_Char_Index((FT_Face)old_charmap,(ulong)(uint)style_class);
      if ((FVar2 != 0) && (FVar2 < pAStack_10->glyph_count)) {
        _i[FVar2] = _i[FVar2] | 0x8000;
      }
    }
  }
  else {
    face._4_4_ = 0;
  }
  if (pAStack_10->module->fallback_style != 0x3fff) {
    for (local_80 = 0; local_80 < pAStack_10->glyph_count; local_80 = local_80 + 1) {
      if ((_i[local_80] & 0x3fff) == 0x3fff) {
        _i[local_80] = _i[local_80] & 0xc000;
        _i[local_80] = _i[local_80] | (ushort)pAStack_10->module->fallback_style;
      }
    }
  }
  *(FT_UShort **)&old_charmap[10].encoding = gstyles;
  return face._4_4_;
}

Assistant:

static FT_Error
  af_face_globals_compute_style_coverage( AF_FaceGlobals  globals )
  {
    FT_Error    error;
    FT_Face     face        = globals->face;
    FT_CharMap  old_charmap = face->charmap;
    FT_UShort*  gstyles     = globals->glyph_styles;
    FT_UShort   ss;
    FT_UShort   dflt        = 0xFFFFU; /* a non-valid value */
    FT_UInt     i;


    /* the value AF_STYLE_UNASSIGNED means `uncovered glyph' */
    for ( i = 0; i < globals->glyph_count; i++ )
      gstyles[i] = AF_STYLE_UNASSIGNED;

    error = FT_Select_Charmap( face, FT_ENCODING_UNICODE );
    if ( error )
    {
      /*
       * Ignore this error; we simply use the fallback style.
       * XXX: Shouldn't we rather disable hinting?
       */
      error = FT_Err_Ok;
      goto Exit;
    }

    /* scan each style in a Unicode charmap */
    for ( ss = 0; af_style_classes[ss]; ss++ )
    {
      AF_StyleClass       style_class =
                            af_style_classes[ss];
      AF_ScriptClass      script_class =
                            af_script_classes[style_class->script];
      AF_Script_UniRange  range;


      if ( !script_class->script_uni_ranges )
        continue;

      /*
       * Scan all Unicode points in the range and set the corresponding
       * glyph style index.
       */
      if ( style_class->coverage == AF_COVERAGE_DEFAULT )
      {
        if ( style_class->script == globals->module->default_script )
          dflt = ss;

        for ( range = script_class->script_uni_ranges;
              range->first != 0;
              range++ )
        {
          FT_ULong  charcode = range->first;
          FT_UInt   gindex;


          gindex = FT_Get_Char_Index( face, charcode );

          if ( gindex != 0                                                &&
               gindex < globals->glyph_count                              &&
               ( gstyles[gindex] & AF_STYLE_MASK ) == AF_STYLE_UNASSIGNED )
            gstyles[gindex] = ss;

          for (;;)
          {
            charcode = FT_Get_Next_Char( face, charcode, &gindex );

            if ( gindex == 0 || charcode > range->last )
              break;

            if ( gindex < globals->glyph_count                              &&
                 ( gstyles[gindex] & AF_STYLE_MASK ) == AF_STYLE_UNASSIGNED )
              gstyles[gindex] = ss;
          }
        }

        /* do the same for the script's non-base characters */
        for ( range = script_class->script_uni_nonbase_ranges;
              range->first != 0;
              range++ )
        {
          FT_ULong  charcode = range->first;
          FT_UInt   gindex;


          gindex = FT_Get_Char_Index( face, charcode );

          if ( gindex != 0                               &&
               gindex < globals->glyph_count             &&
               ( gstyles[gindex] & AF_STYLE_MASK ) == ss )
            gstyles[gindex] |= AF_NONBASE;

          for (;;)
          {
            charcode = FT_Get_Next_Char( face, charcode, &gindex );

            if ( gindex == 0 || charcode > range->last )
              break;

            if ( gindex < globals->glyph_count             &&
                 ( gstyles[gindex] & AF_STYLE_MASK ) == ss )
              gstyles[gindex] |= AF_NONBASE;
          }
        }
      }
      else
      {
        /* get glyphs not directly addressable by cmap */
        af_shaper_get_coverage( globals, style_class, gstyles, 0 );
      }
    }

    /* handle the remaining default OpenType features ... */
    for ( ss = 0; af_style_classes[ss]; ss++ )
    {
      AF_StyleClass  style_class = af_style_classes[ss];


      if ( style_class->coverage == AF_COVERAGE_DEFAULT )
        af_shaper_get_coverage( globals, style_class, gstyles, 0 );
    }

    /* ... and finally the default OpenType features of the default script */
    af_shaper_get_coverage( globals, af_style_classes[dflt], gstyles, 1 );

    /* mark ASCII digits */
    for ( i = 0x30; i <= 0x39; i++ )
    {
      FT_UInt  gindex = FT_Get_Char_Index( face, i );


      if ( gindex != 0 && gindex < globals->glyph_count )
        gstyles[gindex] |= AF_DIGIT;
    }

  Exit:
    /*
     * By default, all uncovered glyphs are set to the fallback style.
     * XXX: Shouldn't we disable hinting or do something similar?
     */
    if ( globals->module->fallback_style != AF_STYLE_UNASSIGNED )
    {
      FT_UInt  nn;


      for ( nn = 0; nn < globals->glyph_count; nn++ )
      {
        if ( ( gstyles[nn] & AF_STYLE_MASK ) == AF_STYLE_UNASSIGNED )
        {
          gstyles[nn] &= ~AF_STYLE_MASK;
          gstyles[nn] |= globals->module->fallback_style;
        }
      }
    }

#ifdef FT_DEBUG_LEVEL_TRACE

    FT_TRACE4(( "\n" ));
    FT_TRACE4(( "style coverage\n" ));
    FT_TRACE4(( "==============\n" ));
    FT_TRACE4(( "\n" ));

    for ( ss = 0; af_style_classes[ss]; ss++ )
    {
      AF_StyleClass  style_class = af_style_classes[ss];
      FT_UInt        count       = 0;
      FT_UInt        idx;


      FT_TRACE4(( "%s:\n", af_style_names[style_class->style] ));

      for ( idx = 0; idx < globals->glyph_count; idx++ )
      {
        if ( ( gstyles[idx] & AF_STYLE_MASK ) == style_class->style )
        {
          if ( !( count % 10 ) )
            FT_TRACE4(( " " ));

          FT_TRACE4(( " %d", idx ));
          count++;

          if ( !( count % 10 ) )
            FT_TRACE4(( "\n" ));
        }
      }

      if ( !count )
        FT_TRACE4(( "  (none)\n" ));
      if ( count % 10 )
        FT_TRACE4(( "\n" ));
    }

#endif /* FT_DEBUG_LEVEL_TRACE */

    face->charmap = old_charmap;
    return error;
  }